

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

Vector * __thiscall Vector::fullName(Vector *this,string *element_name)

{
  string local_38 [32];
  string *local_18;
  string *element_name_local;
  
  local_18 = element_name;
  element_name_local = (string *)this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/std/vector<"
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

string Vector::fullName(std::string const& element_name)
{ return "/std/vector<" + element_name + ">"; }